

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixmake.cpp
# Opt level: O2

QStringList * __thiscall
UnixMakefileGenerator::findDependencies(UnixMakefileGenerator *this,QString *f)

{
  char16_t **this_00;
  long lVar1;
  QMakeProject *pQVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  bool bVar6;
  int iVar7;
  QListSpecialMethods<QString> *this_01;
  ProStringList *pPVar8;
  ProString *pPVar9;
  QString *pQVar10;
  iterator sub;
  iterator iVar11;
  QList<ProString> *pQVar12;
  iterator other;
  iterator iVar13;
  iterator this_02;
  iterator iVar14;
  ProString *arch_1;
  ProString *pPVar15;
  long lVar16;
  ProString *arch;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_178;
  QArrayDataPointer<ProString> local_160;
  ProString local_148;
  ProString language;
  QArrayDataPointer<char16_t> local_d8;
  ProString extensionSuffix;
  QArrayDataPointer<char16_t> local_88;
  ProString file;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (QListSpecialMethods<QString> *)
            MakefileGenerator::findDependencies(&this->super_MakefileGenerator,f);
  iVar7 = (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
            [0x21])(this);
  if ((char)iVar7 != '\0') {
    pQVar2 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&language,"PRECOMPILED_HEADER");
    bVar6 = QMakeProject::isEmpty(pQVar2,(ProKey *)&language);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&language);
    if (!bVar6) {
      file.m_file = -0x55555556;
      file._36_4_ = 0xaaaaaaaa;
      file.m_hash = 0xaaaaaaaaaaaaaaaa;
      file.m_string.d.size = -0x5555555555555556;
      file.m_offset = -0x55555556;
      file.m_length = -0x55555556;
      file.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      file.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      ProString::ProString(&file,f);
      local_88.d = (Data *)0x0;
      local_88.ptr = (char16_t *)0x0;
      local_88.size = 0;
      pQVar2 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&language,"PRECOMPILED_DIR");
      bVar6 = QMakeProject::isEmpty(pQVar2,(ProKey *)&language);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&language);
      if (!bVar6) {
        pQVar2 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&extensionSuffix,"PRECOMPILED_DIR");
        QMakeEvaluator::first(&language,&pQVar2->super_QMakeEvaluator,(ProKey *)&extensionSuffix);
        ProString::toQString(&local_148.m_string,&language);
        qVar5 = local_88.size;
        pcVar4 = local_88.ptr;
        pDVar3 = local_88.d;
        local_88.d = local_148.m_string.d.d;
        local_88.ptr = local_148.m_string.d.ptr;
        local_148.m_string.d.d = pDVar3;
        local_148.m_string.d.ptr = pcVar4;
        local_88.size = local_148.m_string.d.size;
        local_148.m_string.d.size = qVar5;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_148);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&language);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&extensionSuffix);
      }
      pQVar2 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&extensionSuffix,"QMAKE_ORIG_TARGET");
      QMakeEvaluator::first(&language,&pQVar2->super_QMakeEvaluator,(ProKey *)&extensionSuffix);
      ProString::toQString(&local_148.m_string,&language);
      QString::append((QString *)&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_148);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&language);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&extensionSuffix);
      pQVar2 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&extensionSuffix,"QMAKE_PCH_OUTPUT_EXT");
      QMakeEvaluator::first(&language,&pQVar2->super_QMakeEvaluator,(ProKey *)&extensionSuffix);
      ProString::toQString(&local_148.m_string,&language);
      QString::append((QString *)&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_148);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&language);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&extensionSuffix);
      pQVar2 = (this->super_MakefileGenerator).project;
      QString::QString(&language.m_string,"icc_pch_style");
      bVar6 = QMakeProject::isActiveConfig(pQVar2,&language.m_string,false);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&language);
      if (bVar6) {
        pQVar2 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&language,"QMAKE_PCH_ARCHS");
        pPVar8 = QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&language);
        extensionSuffix.m_string.d.d = (Data *)(pPVar8->super_QList<ProString>).d.d;
        extensionSuffix.m_string.d.ptr = (char16_t *)(pPVar8->super_QList<ProString>).d.ptr;
        lVar16 = (pPVar8->super_QList<ProString>).d.size;
        if (extensionSuffix.m_string.d.d != (Data *)0x0) {
          LOCK();
          (((Data *)extensionSuffix.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i =
               (((Data *)extensionSuffix.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        extensionSuffix.m_string.d.size = lVar16;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&language);
        if (lVar16 == 0) {
          ProString::ProString(&language);
          QList<ProString>::emplaceBack<ProString_const&>
                    ((QList<ProString> *)&extensionSuffix,&language);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&language);
          lVar16 = extensionSuffix.m_string.d.size;
        }
        pPVar9 = (ProString *)(extensionSuffix.m_string.d.ptr + lVar16 * 0x18);
        for (pPVar15 = (ProString *)extensionSuffix.m_string.d.ptr; pPVar15 != pPVar9;
            pPVar15 = pPVar15 + 1) {
          language.m_string.d.d = local_88.d;
          language.m_string.d.ptr = local_88.ptr;
          language.m_string.d.size = local_88.size;
          if (local_88.d != (Data *)0x0) {
            LOCK();
            ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          if (pPVar15->m_length != 0) {
            pQVar10 = (QString *)QtPrivate::lengthHelperPointer<char>("${QMAKE_PCH_ARCH}");
            ProString::toQString(&local_148.m_string,pPVar15);
            QString::replace((QLatin1String *)&language,pQVar10,0x21c339);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_148);
          }
          sub = QList<QString>::begin(&Option::cpp_ext);
          do {
            iVar11 = QList<QString>::end(&Option::cpp_ext);
            if (sub.i == iVar11.i) goto LAB_00179034;
            bVar6 = ProString::endsWith(&file,sub.i,CaseSensitive);
            sub.i = sub.i + 1;
          } while (!bVar6);
          QList<QString>::emplaceBack<QString_const&>((QList<QString> *)this_01,&language.m_string);
LAB_00179034:
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&language);
        }
        QArrayDataPointer<ProString>::~QArrayDataPointer
                  ((QArrayDataPointer<ProString> *)&extensionSuffix);
      }
      else {
        local_d8.size = -0x5555555555555556;
        local_d8.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_d8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        pQVar2 = (this->super_MakefileGenerator).project;
        QString::QString(&local_148.m_string,"clang_pch_style");
        bVar6 = QMakeProject::isActiveConfig(pQVar2,&local_148.m_string,false);
        if (bVar6) {
          pQVar2 = (this->super_MakefileGenerator).project;
          ProKey::ProKey((ProKey *)&extensionSuffix,"QMAKE_PCH_OUTPUT_EXT");
          QMakeEvaluator::first(&language,&pQVar2->super_QMakeEvaluator,(ProKey *)&extensionSuffix);
          ProString::toQString((QString *)&local_d8,&language);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&language);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&extensionSuffix);
        }
        else {
          QString::QString((QString *)&local_d8,"");
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_148);
        pQVar2 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&local_148,"QMAKE_PRECOMP_PREFIX");
        QMakeEvaluator::first(&extensionSuffix,&pQVar2->super_QMakeEvaluator,(ProKey *)&local_148);
        this_00 = &language.m_string.d.ptr;
        language.m_string.d.d = (Data *)&Option::dir_sep;
        ProString::ProString((ProString *)this_00,&extensionSuffix);
        ::operator+=((QString *)&local_88,(QStringBuilder<QString_&,_ProString> *)&language);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_00);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&extensionSuffix);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_148);
        pQVar2 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&language,"QMAKE_BUILTIN_COMPILERS");
        pQVar12 = &QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&language)->
                   super_QList<ProString>;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&language);
        other = QList<ProString>::begin(pQVar12);
        iVar13 = QList<ProString>::end(pQVar12);
        for (; other.i != iVar13.i; other.i = other.i + 1) {
          pQVar2 = (this->super_MakefileGenerator).project;
          extensionSuffix.m_string.d.d = (Data *)0x21ae12;
          extensionSuffix.m_string.d.size = (qsizetype)anon_var_dwarf_1c23a2;
          extensionSuffix.m_string.d.ptr = (char16_t *)other.i;
          ProString::ProString<QStringBuilder<char_const(&)[7],ProString_const&>,char_const(&)[17]>
                    (&language,
                     (QStringBuilder<QStringBuilder<const_char_(&)[7],_const_ProString_&>,_const_char_(&)[17]>
                      *)&extensionSuffix);
          bVar6 = QMakeProject::isEmpty(pQVar2,(ProKey *)&language);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&language);
          if (!bVar6) {
            language.m_file = -0x55555556;
            language._36_4_ = 0xaaaaaaaa;
            language.m_hash = 0xaaaaaaaaaaaaaaaa;
            language.m_string.d.size = -0x5555555555555556;
            language.m_offset = -0x55555556;
            language.m_length = -0x55555556;
            language.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
            language.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
            pQVar2 = (this->super_MakefileGenerator).project;
            local_148.m_string.d.d = (Data *)0x21c36f;
            local_148.m_string.d.ptr = (char16_t *)other.i;
            ProString::ProString<char_const(&)[16],ProString_const&>
                      (&extensionSuffix,
                       (QStringBuilder<const_char_(&)[16],_const_ProString_&> *)&local_148);
            QMakeEvaluator::first
                      (&language,&pQVar2->super_QMakeEvaluator,(ProKey *)&extensionSuffix);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&extensionSuffix);
            if (language.m_length == 0) {
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&language);
            }
            else {
              extensionSuffix.m_file = -0x55555556;
              extensionSuffix._36_4_ = 0xaaaaaaaa;
              extensionSuffix.m_hash = 0xaaaaaaaaaaaaaaaa;
              extensionSuffix.m_string.d.size = -0x5555555555555556;
              extensionSuffix.m_offset = -0x55555556;
              extensionSuffix.m_length = -0x55555556;
              extensionSuffix.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
              extensionSuffix.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
              ProString::ProString(&extensionSuffix,other.i);
              bVar6 = ProString::operator==(&extensionSuffix,"CXX");
              if (bVar6) {
                ProString::ProString(&local_148,"CPP");
                ProString::operator=(&extensionSuffix,&local_148);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_148);
              }
              pQVar2 = (this->super_MakefileGenerator).project;
              local_160.d = (Data *)0x21a9b6;
              local_160.ptr = &extensionSuffix;
              ProString::ProString<char_const(&)[11],ProString&>
                        (&local_148,(QStringBuilder<const_char_(&)[11],_ProString_&> *)&local_160);
              pQVar12 = &QMakeEvaluator::valuesRef
                                   (&pQVar2->super_QMakeEvaluator,(ProKey *)&local_148)->
                         super_QList<ProString>;
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_148);
              this_02 = QList<ProString>::begin(pQVar12);
              iVar14 = QList<ProString>::end(pQVar12);
              while (this_02.i != iVar14.i) {
                ProString::toQString(&local_148.m_string,this_02.i);
                bVar6 = ProString::endsWith(&file,&local_148.m_string,CaseSensitive);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_148);
                this_02.i = this_02.i + 1;
                if (bVar6) {
                  pQVar2 = (this->super_MakefileGenerator).project;
                  ProKey::ProKey((ProKey *)&local_148,"QMAKE_PCH_ARCHS");
                  pPVar8 = QMakeEvaluator::valuesRef
                                     (&pQVar2->super_QMakeEvaluator,(ProKey *)&local_148);
                  local_160.d = (pPVar8->super_QList<ProString>).d.d;
                  local_160.ptr = (pPVar8->super_QList<ProString>).d.ptr;
                  local_160.size = (pPVar8->super_QList<ProString>).d.size;
                  if (local_160.d != (Data *)0x0) {
                    LOCK();
                    ((local_160.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         ((local_160.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + 1;
                    UNLOCK();
                  }
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_148);
                  if (local_160.size == 0) {
                    ProString::ProString(&local_148);
                    QList<ProString>::emplaceBack<ProString_const&>
                              ((QList<ProString> *)&local_160,&local_148);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)&local_148);
                  }
                  lVar16 = local_160.size * 0x30;
                  pPVar15 = local_160.ptr;
                  while( true ) {
                    if (lVar16 == 0) break;
                    local_148.m_string.d.size = -0x5555555555555556;
                    local_148.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
                    local_148.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
                    local_178.d = (Data *)&local_88;
                    local_178.ptr = (char16_t *)&language;
                    local_178.size = (qsizetype)&local_d8;
                    QStringBuilder<QStringBuilder<QString_&,_ProString_&>,_QString_&>::
                    convertTo<QString>(&local_148.m_string,
                                       (QStringBuilder<QStringBuilder<QString_&,_ProString_&>,_QString_&>
                                        *)&local_178);
                    if (pPVar15->m_length != 0) {
                      pQVar10 = (QString *)QtPrivate::lengthHelperPointer<char>("${QMAKE_PCH_ARCH}")
                      ;
                      ProString::toQString((QString *)&local_178,pPVar15);
                      QString::replace((QLatin1String *)&local_148,pQVar10,0x21c339);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
                    }
                    bVar6 = QListSpecialMethods<QString>::contains
                                      (this_01,&local_148.m_string,CaseSensitive);
                    if (!bVar6) {
                      QList<QString>::emplaceBack<QString_const&>
                                ((QList<QString> *)this_01,&local_148.m_string);
                    }
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)&local_148);
                    pPVar15 = pPVar15 + 1;
                    lVar16 = lVar16 + -0x30;
                  }
                  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_160);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&extensionSuffix);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&language);
                  goto LAB_00179572;
                }
              }
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&extensionSuffix);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&language);
            }
          }
        }
LAB_00179572:
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&file);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QStringList *)this_01;
  }
  __stack_chk_fail();
}

Assistant:

QStringList
&UnixMakefileGenerator::findDependencies(const QString &f)
{
    QStringList &ret = MakefileGenerator::findDependencies(f);
    if (doPrecompiledHeaders() && !project->isEmpty("PRECOMPILED_HEADER")) {
        ProString file = f;
        QString header_prefix;
        if(!project->isEmpty("PRECOMPILED_DIR"))
            header_prefix = project->first("PRECOMPILED_DIR").toQString();
        header_prefix += project->first("QMAKE_ORIG_TARGET").toQString();
        header_prefix += project->first("QMAKE_PCH_OUTPUT_EXT").toQString();
        if (project->isActiveConfig("icc_pch_style")) {
            // icc style
            ProStringList pchArchs = project->values("QMAKE_PCH_ARCHS");
            if (pchArchs.isEmpty())
                pchArchs << ProString(); // normal single-arch PCH
            for (const ProString &arch : std::as_const(pchArchs)) {
                auto pfx = header_prefix;
                if (!arch.isEmpty())
                    pfx.replace(QLatin1String("${QMAKE_PCH_ARCH}"), arch.toQString());
                for (QStringList::Iterator it = Option::cpp_ext.begin();
                    it != Option::cpp_ext.end(); ++it) {
                    if (file.endsWith(*it)) {
                        ret += pfx;
                        break;
                    }
                }
            }
        } else {
            // gcc style (including clang_pch_style)
            QString header_suffix = project->isActiveConfig("clang_pch_style")
                    ? project->first("QMAKE_PCH_OUTPUT_EXT").toQString() : "";
            header_prefix += Option::dir_sep + project->first("QMAKE_PRECOMP_PREFIX");

            for (const ProString &compiler : project->values("QMAKE_BUILTIN_COMPILERS")) {
                if (project->isEmpty(ProKey("QMAKE_" + compiler + "FLAGS_PRECOMPILE")))
                    continue;

                ProString language = project->first(ProKey("QMAKE_LANGUAGE_" + compiler));
                if (language.isEmpty())
                    continue;

                // Unfortunately we were not consistent about the C++ naming
                ProString extensionSuffix = compiler;
                if (extensionSuffix == "CXX")
                    extensionSuffix = ProString("CPP");

                for (const ProString &extension : project->values(ProKey("QMAKE_EXT_" + extensionSuffix))) {
                    if (!file.endsWith(extension.toQString()))
                        continue;

                    ProStringList pchArchs = project->values("QMAKE_PCH_ARCHS");
                    if (pchArchs.isEmpty())
                        pchArchs << ProString(); // normal single-arch PCH
                    for (const ProString &arch : std::as_const(pchArchs)) {
                        QString precompiledHeader = header_prefix + language + header_suffix;
                        if (!arch.isEmpty()) {
                            precompiledHeader.replace(QLatin1String("${QMAKE_PCH_ARCH}"),
                                                      arch.toQString());
                        }
                        if (!ret.contains(precompiledHeader))
                            ret += precompiledHeader;
                    }

                    goto foundPrecompiledDependency;
                }
            }
          foundPrecompiledDependency:
            ; // Hurray!!
        }
    }
    return ret;
}